

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddString
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,string *value)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Type TVar4;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  FieldOptions *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  string *value_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddString","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddString",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"AddString",CPPTYPE_STRING);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    TVar4 = FieldDescriptor::type(field);
    ExtensionSet::AddString(this_00,number,(FieldType)TVar4,value,field);
  }
  else {
    this_01 = FieldDescriptor::options(field);
    FieldOptions::ctype(this_01);
    this_02 = AddField<std::__cxx11::string>(this,message,field);
    std::__cxx11::string::operator=((string *)this_02,(string *)value);
  }
  return;
}

Assistant:

void GeneratedMessageReflection::AddString(
    Message* message, const FieldDescriptor* field,
    const string& value) const {
  USAGE_CHECK_ALL(AddString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddString(field->number(),
                                            field->type(), value, field);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        *AddField<string>(message, field) = value;
        break;
    }
  }
}